

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cTextureViewTests.cpp
# Opt level: O0

char * gl4cts::TextureViewUtilities::getErrorCodeString(GLint error_code)

{
  char *pcStack_10;
  GLint error_code_local;
  
  if (error_code == 0) {
    pcStack_10 = "GL_NO_ERROR";
  }
  else if (error_code == 0x500) {
    pcStack_10 = "GL_INVALID_ENUM";
  }
  else if (error_code == 0x501) {
    pcStack_10 = "GL_INVALID_VALUE";
  }
  else if (error_code == 0x502) {
    pcStack_10 = "GL_INVALID_OPERATION";
  }
  else if (error_code == 0x503) {
    pcStack_10 = "GL_STACK_OVERFLOW";
  }
  else if (error_code == 0x504) {
    pcStack_10 = "GL_STACK_UNDERFLOW";
  }
  else if (error_code == 0x505) {
    pcStack_10 = "GL_OUT_OF_MEMORY";
  }
  else if (error_code == 0x506) {
    pcStack_10 = "GL_INVALID_FRAMEBUFFER_OPERATION";
  }
  else {
    pcStack_10 = "[?]";
  }
  return pcStack_10;
}

Assistant:

const char* TextureViewUtilities::getErrorCodeString(const glw::GLint error_code)
{
	switch (error_code)
	{
	case GL_INVALID_ENUM:
		return "GL_INVALID_ENUM";
	case GL_INVALID_FRAMEBUFFER_OPERATION:
		return "GL_INVALID_FRAMEBUFFER_OPERATION";
	case GL_INVALID_OPERATION:
		return "GL_INVALID_OPERATION";
	case GL_INVALID_VALUE:
		return "GL_INVALID_VALUE";
	case GL_NO_ERROR:
		return "GL_NO_ERROR";
	case GL_OUT_OF_MEMORY:
		return "GL_OUT_OF_MEMORY";
	case GL_STACK_OVERFLOW:
		return "GL_STACK_OVERFLOW";
	case GL_STACK_UNDERFLOW:
		return "GL_STACK_UNDERFLOW";
	default:
		return "[?]";
	}
}